

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testRdExpParser.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  long lVar1;
  ifstream fin;
  
  if (argc == 1) {
    parse();
  }
  else {
    for (lVar1 = 1; lVar1 < argc; lVar1 = lVar1 + 1) {
      std::ifstream::ifstream(&fin,argv[lVar1],_S_in);
      std::ios::rdbuf((streambuf *)((long)&std::cin + *(long *)(std::cin + -0x18)));
      parse();
      std::ifstream::close();
      std::ios::rdbuf((streambuf *)((long)&std::cin + *(long *)(std::cin + -0x18)));
      std::ifstream::~ifstream(&fin);
    }
  }
  return 0;
}

Assistant:

int main(int argc, char *argv[])
{
    if (argc == 1)
        parse();
    else
        for (int i = 1; i < argc; i++)
        {
            std::ifstream fin(argv[i]);
            auto cinBuf = std::cin.rdbuf(fin.rdbuf());
            parse();
            fin.close();
            std::cin.rdbuf(cinBuf);
        }
}